

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_toStringForUnmodifiedOutputParameter_Test::testBody
          (TEST_MockExpectedCall_toStringForUnmodifiedOutputParameter_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_f0 [64];
  undefined1 local_b0 [8];
  MockCheckedExpectedCall expectedCall;
  TEST_MockExpectedCall_toStringForUnmodifiedOutputParameter_Test *this_local;
  
  expectedCall._152_8_ = this;
  MockCheckedExpectedCall::MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0,1);
  SimpleString::SimpleString((SimpleString *)(local_f0 + 0x30),"name");
  MockCheckedExpectedCall::withName
            ((MockCheckedExpectedCall *)local_b0,(SimpleString *)(local_f0 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_f0 + 0x30));
  SimpleString::SimpleString((SimpleString *)(local_f0 + 0x10),"buffer1");
  MockCheckedExpectedCall::withUnmodifiedOutputParameter
            ((MockCheckedExpectedCall *)local_b0,(SimpleString *)(local_f0 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_f0 + 0x10));
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)local_b0,1);
  pUVar1 = UtestShell::getCurrent();
  MockCheckedExpectedCall::callToString((MockCheckedExpectedCall *)local_f0);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_f0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"name -> const void* buffer1: <output> (expected 1 call, called 1 time)",pcVar2,
             0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x270,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_f0);
  MockCheckedExpectedCall::~MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0);
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForUnmodifiedOutputParameter)
{
    MockCheckedExpectedCall expectedCall(1);
    expectedCall.withName("name");
    expectedCall.withUnmodifiedOutputParameter("buffer1");
    expectedCall.callWasMade(1);
    STRCMP_EQUAL("name -> const void* buffer1: <output> (expected 1 call, called 1 time)", expectedCall.callToString().asCharString());
}